

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

Phase __thiscall Js::Phases::GetFirstPhase(Phases *this)

{
  int local_1c;
  int i;
  Phases *this_local;
  
  local_1c = -1;
  do {
    local_1c = local_1c + 1;
    if (((this->phaseList[local_1c].valid ^ 0xffU) & 1) == 0) {
      return (Phase)local_1c;
    }
  } while (local_1c < 0x174);
  return InvalidPhase;
}

Assistant:

Phase
    Phases::GetFirstPhase()
    {
        int i= -1;
        while(!this->phaseList[++i].valid)
        {
            if(i >= PhaseCount - 1)
            {
                return InvalidPhase;
            }
        }
        return Phase(i);
    }